

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_suite.cpp
# Opt level: O0

void wvector_suite::test_view(void)

{
  vector<wchar_t,_std::allocator<wchar_t>_> **ppvVar1;
  size_type size;
  iterator iVar2;
  iterator iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  size_t __n;
  undefined1 auVar6 [16];
  char *msg;
  void *local_70;
  undefined1 local_64;
  undefined1 local_63 [2];
  allocator<wchar_t> local_61;
  wstring local_60 [8];
  wstring input;
  undefined1 local_30 [8];
  vector_buffer<wchar_t,_trial::protocol::buffer::vector<wchar_t,_std::allocator<wchar_t>_>_>
  container;
  vector<wchar_t,_std::allocator<wchar_t>_> output;
  
  ppvVar1 = &container.super_vector<wchar_t,_std::allocator<wchar_t>_>.buffer;
  std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
            ((vector<wchar_t,_std::allocator<wchar_t>_> *)ppvVar1);
  vector_buffer<wchar_t,_trial::protocol::buffer::vector<wchar_t,_std::allocator<wchar_t>_>_>::
  vector_buffer((vector_buffer<wchar_t,_trial::protocol::buffer::vector<wchar_t,_std::allocator<wchar_t>_>_>
                 *)local_30,(vector<wchar_t,_std::allocator<wchar_t>_> *)ppvVar1);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_60,L"alpha",&local_61);
  std::allocator<wchar_t>::~allocator(&local_61);
  size = std::__cxx11::wstring::size();
  local_63[0] = vector_buffer<wchar_t,_trial::protocol::buffer::vector<wchar_t,_std::allocator<wchar_t>_>_>
                ::grow((vector_buffer<wchar_t,_trial::protocol::buffer::vector<wchar_t,_std::allocator<wchar_t>_>_>
                        *)local_30,size);
  local_64 = 1;
  __n = 0xc5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("container.grow(input.size())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/vector_suite.cpp"
             ,0xc5,"void wvector_suite::test_view()",local_63,&local_64);
  auVar6 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_60);
  local_70 = auVar6._8_8_;
  msg = auVar6._0_8_;
  vector_buffer<wchar_t,_trial::protocol::buffer::vector<wchar_t,_std::allocator<wchar_t>_>_>::write
            ((vector_buffer<wchar_t,_trial::protocol::buffer::vector<wchar_t,_std::allocator<wchar_t>_>_>
              *)local_30,(int)&msg,local_70,__n);
  ppvVar1 = &container.super_vector<wchar_t,_std::allocator<wchar_t>_>.buffer;
  iVar2 = std::vector<wchar_t,_std::allocator<wchar_t>_>::begin
                    ((vector<wchar_t,_std::allocator<wchar_t>_> *)ppvVar1);
  iVar3 = std::vector<wchar_t,_std::allocator<wchar_t>_>::end
                    ((vector<wchar_t,_std::allocator<wchar_t>_> *)ppvVar1);
  uVar4 = std::__cxx11::wstring::begin();
  uVar5 = std::__cxx11::wstring::end();
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<wchar_t*,std::vector<wchar_t,std::allocator<wchar_t>>>,__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::equal_to<wchar_t>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/vector_suite.cpp"
             ,0xca,"void wvector_suite::test_view()",iVar2._M_current,iVar3._M_current,uVar4,uVar5);
  std::__cxx11::wstring::~wstring(local_60);
  vector_buffer<wchar_t,_trial::protocol::buffer::vector<wchar_t,_std::allocator<wchar_t>_>_>::
  ~vector_buffer((vector_buffer<wchar_t,_trial::protocol::buffer::vector<wchar_t,_std::allocator<wchar_t>_>_>
                  *)local_30);
  std::vector<wchar_t,_std::allocator<wchar_t>_>::~vector
            ((vector<wchar_t,_std::allocator<wchar_t>_> *)
             &container.super_vector<wchar_t,_std::allocator<wchar_t>_>.buffer);
  return;
}

Assistant:

void test_view()
{
    std::vector<wchar_t> output;
    vector_buffer<wchar_t> container(output);
    std::wstring input = L"alpha";
    TRIAL_PROTOCOL_TEST_EQUAL(container.grow(input.size()), true);
    TRIAL_PROTOCOL_TEST_NO_THROW(container.write(input));

    TRIAL_PROTOCOL_TEST_ALL_WITH(output.begin(), output.end(),
                                 input.begin(), input.end(),
                                 std::equal_to<wchar_t>());
}